

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void mcbsp_move(void *payload,mcbsp_size_t reception_bytes)

{
  bool bVar1;
  size_t bytes;
  unsigned_long *puVar2;
  void *__src;
  size_t local_48;
  size_t local_40;
  size_t size;
  TicToc t;
  mcbsp_size_t reception_bytes_local;
  void *payload_local;
  
  t.m_nbytes = reception_bytes;
  if ((s_spmd == (Spmd *)0x0) || (bVar1 = bsplib::Spmd::closed(s_spmd), bVar1)) {
    bsp_abort("bsp_move: can only be called within SPMD section\n");
  }
  if ((payload == (void *)0x0) && (t.m_nbytes != 0)) {
    bsp_abort("bsp_move: payload may not be NULL if size parameter is non-zero\n");
  }
  bVar1 = bsplib::Bsmp::empty(s_bsmp);
  if (bVar1) {
    bsp_abort("bsp_move: Message queue was empty\n");
  }
  bytes = bsplib::Bsmp::payload_size(s_bsmp);
  bsplib::TicToc::TicToc((TicToc *)&size,BSMP,bytes);
  local_48 = bsplib::Bsmp::payload_size(s_bsmp);
  puVar2 = std::min<unsigned_long>(&t.m_nbytes,&local_48);
  local_40 = *puVar2;
  __src = bsplib::Bsmp::payload(s_bsmp);
  memcpy(payload,__src,local_40);
  bsplib::Bsmp::pop(s_bsmp);
  bsplib::TicToc::~TicToc((TicToc *)&size);
  return;
}

Assistant:

void mcbsp_move( void * payload, mcbsp_size_t reception_bytes )
{
     if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_move: can only be called within SPMD section\n");

     if ( payload == NULL && reception_bytes > 0 )
        bsp_abort("bsp_move: payload may not be NULL if size parameter is non-zero\n");

     if ( s_bsmp->empty() )
         bsp_abort("bsp_move: Message queue was empty\n");

#ifdef PROFILE
     TicToc t( TicToc::BSMP, s_bsmp->payload_size() );
#endif

     size_t size =
         std::min< size_t >( reception_bytes, s_bsmp->payload_size() );
     std::memcpy( payload, s_bsmp->payload(), size );
     s_bsmp->pop();
}